

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tile.cxx
# Opt level: O2

void set_cursor(Fl_Tile *t,Fl_Cursor c)

{
  Fl_Window *pFVar1;
  
  if (set_cursor::cursor != c) {
    pFVar1 = Fl_Widget::window((Fl_Widget *)t);
    if (pFVar1 != (Fl_Window *)0x0) {
      set_cursor::cursor = c;
      pFVar1 = Fl_Widget::window((Fl_Widget *)t);
      Fl_Window::cursor(pFVar1,c);
      return;
    }
  }
  return;
}

Assistant:

static void set_cursor(Fl_Tile*t, Fl_Cursor c) {
  static Fl_Cursor cursor;
  if (cursor == c || !t->window()) return;
  cursor = c;
#ifdef __sgi
  t->window()->cursor(c,FL_RED,FL_WHITE);
#else
  t->window()->cursor(c);
#endif
}